

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amd_ext_to_khr.cpp
# Opt level: O2

bool spvtools::opt::anon_unknown_7::ReplaceTrinaryMinMax<(GLSLstd450)38>
               (IRContext *ctx,Instruction *inst,
               vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
               *param_3)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t result_type;
  FeatureManager *pFVar3;
  uint32_t set;
  initializer_list<unsigned_int> init_list;
  initializer_list<unsigned_int> init_list_00;
  initializer_list<unsigned_int> init_list_01;
  initializer_list<unsigned_int> init_list_02;
  uint local_e0;
  uint32_t local_dc;
  Instruction *local_d8;
  IRContext *local_d0;
  undefined1 local_c8 [56];
  SmallVector<unsigned_int,_2UL> local_90;
  OperandList new_operands;
  InstructionBuilder ir_builder;
  
  pFVar3 = IRContext::get_feature_mgr(ctx);
  set = pFVar3->extinst_importid_GLSLstd450_;
  if (set == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_c8,"GLSL.std.450",(allocator<char> *)&local_90);
    IRContext::AddExtInstImport(ctx,(string *)local_c8);
    std::__cxx11::string::_M_dispose();
    pFVar3 = IRContext::get_feature_mgr(ctx);
    set = pFVar3->extinst_importid_GLSLstd450_;
  }
  InstructionBuilder::InstructionBuilder
            (&ir_builder,ctx,inst,kAnalysisInstrToBlockMapping|kAnalysisBegin);
  uVar1 = Instruction::GetSingleWordInOperand(inst,2);
  uVar2 = Instruction::GetSingleWordInOperand(inst,3);
  local_dc = Instruction::GetSingleWordInOperand(inst,4);
  result_type = Instruction::type_id(inst);
  local_c8._0_8_ = (pointer)0x0;
  local_c8._8_8_ = (_func_int **)0x0;
  local_c8._16_8_ = 0;
  local_d0 = ctx;
  local_90._vptr_SmallVector._0_4_ = uVar1;
  local_90._vptr_SmallVector._4_4_ = uVar2;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_range_initialize<unsigned_int_const*>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)local_c8,&local_90);
  local_d8 = InstructionBuilder::AddNaryExtendedInstruction
                       (&ir_builder,result_type,set,0x26,
                        (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_c8);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)local_c8);
  new_operands.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  new_operands.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  new_operands.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  init_list._M_len = 1;
  init_list._M_array = &local_e0;
  local_e0 = set;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_90,init_list);
  local_c8._0_4_ = SPV_OPERAND_TYPE_ID;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector
            ((SmallVector<unsigned_int,_2UL> *)(local_c8 + 8),&local_90);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
  emplace_back<spvtools::opt::Operand>(&new_operands,(Operand *)local_c8);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector
            ((SmallVector<unsigned_int,_2UL> *)(local_c8 + 8));
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_90);
  local_e0 = 0x26;
  init_list_00._M_len = 1;
  init_list_00._M_array = &local_e0;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_90,init_list_00);
  local_c8._0_4_ = SPV_OPERAND_TYPE_EXTENSION_INSTRUCTION_NUMBER;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector
            ((SmallVector<unsigned_int,_2UL> *)(local_c8 + 8),&local_90);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
  emplace_back<spvtools::opt::Operand>(&new_operands,(Operand *)local_c8);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector
            ((SmallVector<unsigned_int,_2UL> *)(local_c8 + 8));
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_90);
  local_e0 = Instruction::result_id(local_d8);
  init_list_01._M_len = 1;
  init_list_01._M_array = &local_e0;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_90,init_list_01);
  local_c8._0_4_ = SPV_OPERAND_TYPE_ID;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector
            ((SmallVector<unsigned_int,_2UL> *)(local_c8 + 8),&local_90);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
  emplace_back<spvtools::opt::Operand>(&new_operands,(Operand *)local_c8);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector
            ((SmallVector<unsigned_int,_2UL> *)(local_c8 + 8));
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_90);
  local_e0 = local_dc;
  init_list_02._M_len = 1;
  init_list_02._M_array = &local_e0;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_90,init_list_02);
  local_c8._0_4_ = 1;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector
            ((SmallVector<unsigned_int,_2UL> *)(local_c8 + 8),&local_90);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
  emplace_back<spvtools::opt::Operand>(&new_operands,(Operand *)local_c8);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector
            ((SmallVector<unsigned_int,_2UL> *)(local_c8 + 8));
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_90);
  Instruction::SetInOperands(inst,&new_operands);
  IRContext::UpdateDefUse(local_d0,inst);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
            (&new_operands);
  return true;
}

Assistant:

bool ReplaceTrinaryMinMax(IRContext* ctx, Instruction* inst,
                          const std::vector<const analysis::Constant*>&) {
  uint32_t glsl405_ext_inst_id =
      ctx->get_feature_mgr()->GetExtInstImportId_GLSLstd450();
  if (glsl405_ext_inst_id == 0) {
    ctx->AddExtInstImport("GLSL.std.450");
    glsl405_ext_inst_id =
        ctx->get_feature_mgr()->GetExtInstImportId_GLSLstd450();
  }

  InstructionBuilder ir_builder(
      ctx, inst,
      IRContext::kAnalysisDefUse | IRContext::kAnalysisInstrToBlockMapping);

  uint32_t op1 = inst->GetSingleWordInOperand(2);
  uint32_t op2 = inst->GetSingleWordInOperand(3);
  uint32_t op3 = inst->GetSingleWordInOperand(4);

  Instruction* temp = ir_builder.AddNaryExtendedInstruction(
      inst->type_id(), glsl405_ext_inst_id, opcode, {op1, op2});

  Instruction::OperandList new_operands;
  new_operands.push_back({SPV_OPERAND_TYPE_ID, {glsl405_ext_inst_id}});
  new_operands.push_back({SPV_OPERAND_TYPE_EXTENSION_INSTRUCTION_NUMBER,
                          {static_cast<uint32_t>(opcode)}});
  new_operands.push_back({SPV_OPERAND_TYPE_ID, {temp->result_id()}});
  new_operands.push_back({SPV_OPERAND_TYPE_ID, {op3}});

  inst->SetInOperands(std::move(new_operands));
  ctx->UpdateDefUse(inst);
  return true;
}